

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.h
# Opt level: O1

int32_t __thiscall icu_63::UVector32::push(UVector32 *this,int32_t i,UErrorCode *status)

{
  int iVar1;
  UBool UVar2;
  
  iVar1 = this->count;
  if (((iVar1 < -1) || (this->capacity <= iVar1)) &&
     (UVar2 = expandCapacity(this,iVar1 + 1,status), UVar2 == '\0')) {
    return i;
  }
  this->elements[this->count] = i;
  this->count = this->count + 1;
  return i;
}

Assistant:

inline int32_t UVector32::push(int32_t i, UErrorCode &status) {
    addElement(i, status);
    return i;
}